

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

void __thiscall
GlobOpt::ArrayLowerBoundCheckHoistInfo::SetLoop
          (ArrayLowerBoundCheckHoistInfo *this,Loop *loop,StackSym *indexSym,int indexOffset,
          int offset,Value *indexValue,IntConstantBounds *indexConstantBounds,
          bool isLoopCountBasedBound)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  undefined4 *puVar4;
  
  pBVar3 = CompatibleBoundCheckBlock(this);
  if (pBVar3 != (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x57,"(!CompatibleBoundCheckBlock())","!CompatibleBoundCheckBlock()");
    if (!bVar2) goto LAB_004a0a2e;
    *puVar4 = 0;
  }
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x58,"(loop)","loop");
    if (!bVar2) goto LAB_004a0a2e;
    *puVar4 = 0;
  }
  if (indexSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x59,"(indexSym)","indexSym");
    if (!bVar2) goto LAB_004a0a2e;
    *puVar4 = 0;
  }
  if ((indexSym->field_0x1a & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x5a,"(!indexSym->IsTypeSpec())","!indexSym->IsTypeSpec()");
    if (!bVar2) goto LAB_004a0a2e;
    *puVar4 = 0;
  }
  if (indexValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x5b,"(indexValue)","indexValue");
    if (!bVar2) {
LAB_004a0a2e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->loop = loop;
  this->indexSym = indexSym;
  this->indexOffset = indexOffset;
  this->offset = offset;
  this->indexValueNumber = indexValue->valueNumber;
  this->indexValue = indexValue;
  this->indexConstantBounds = *indexConstantBounds;
  this->isLoopCountBasedBound = isLoopCountBasedBound;
  this->loopCount = (LoopCount *)0x0;
  return;
}

Assistant:

void GlobOpt::ArrayLowerBoundCheckHoistInfo::SetLoop(
    ::Loop *const loop,
    StackSym *const indexSym,
    const int indexOffset,
    const int offset,
    Value *const indexValue,
    const IntConstantBounds &indexConstantBounds,
    const bool isLoopCountBasedBound)
{
    Assert(!CompatibleBoundCheckBlock());
    Assert(loop);
    Assert(indexSym);
    Assert(!indexSym->IsTypeSpec());
    Assert(indexValue);

    this->loop = loop;
    this->indexSym = indexSym;
    this->indexOffset = indexOffset;
    this->offset = offset;
    this->indexValueNumber = indexValue->GetValueNumber();
    this->indexValue = indexValue;
    this->indexConstantBounds = indexConstantBounds;
    this->isLoopCountBasedBound = isLoopCountBasedBound;
    loopCount = nullptr;
}